

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O3

void __thiscall
burst::
difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
::difference_iterator
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
           *this,int *minuend_begin,int *minuend_end,_Base_ptr subtrahend_begin,
          _Base_ptr subtrahend_end)

{
  int *piVar1;
  _Rb_tree_const_iterator<int> _Var2;
  
  (this->m_minuend_begin)._M_current = minuend_begin;
  (this->m_minuend_end)._M_current = minuend_end;
  (this->m_subtrahend_begin)._M_node = subtrahend_begin;
  (this->m_subtrahend_end)._M_node = subtrahend_end;
  if (minuend_begin != minuend_end) {
    piVar1 = minuend_begin + 1;
    do {
      minuend_begin = piVar1;
      if (minuend_begin == minuend_end) goto LAB_00201c01;
      piVar1 = minuend_begin + 1;
    } while (minuend_begin[-1] <= *minuend_begin);
  }
  if (minuend_begin != minuend_end) {
    __assert_fail("std::is_sorted(m_minuend_begin, m_minuend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6b,
                  "burst::difference_iterator<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>, std::_Rb_tree_const_iterator<int>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, ForwardIterator2 = std::_Rb_tree_const_iterator<int>, Compare = std::less<void>]"
                 );
  }
LAB_00201c01:
  _Var2 = std::
          __is_sorted_until<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
                    (subtrahend_begin,subtrahend_end);
  if (_Var2._M_node != subtrahend_end) {
    __assert_fail("std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6c,
                  "burst::difference_iterator<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>, std::_Rb_tree_const_iterator<int>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, ForwardIterator2 = std::_Rb_tree_const_iterator<int>, Compare = std::less<void>]"
                 );
  }
  maintain_invariant(this);
  return;
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }